

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

vec * construct_rhs(vec *__return_storage_ptr__,int nx,int nt,vec *previous_layer,double t,
                   function_2var f,function_2var u)

{
  ulong uVar1;
  double *pdVar2;
  pointer pdVar3;
  double dVar4;
  function_2var p_Var5;
  int iVar6;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  ulong uVar7;
  allocator_type local_69;
  double local_68;
  ulong local_60;
  function_2var local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  value_type_conflict local_38;
  
  local_68 = t;
  local_58 = u;
  if (construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
      ::size == '\0') {
    iVar6 = __cxa_guard_acquire(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                                 ::size,CONCAT44(in_register_00000034,nx),
                                CONCAT44(in_register_00000014,nt));
    if (iVar6 != 0) {
      construct_rhs::size = compute_linear_system_size(nx + -1);
      __cxa_guard_release(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                           ::size);
    }
  }
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)construct_rhs::size,&local_38,&local_69);
  if (construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
      ::h == '\0') {
    construct_rhs();
  }
  if (construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
      ::tau == '\0') {
    construct_rhs();
  }
  local_60 = (ulong)(uint)nx;
  if (1 < nx) {
    uVar7 = 0;
    do {
      local_48 = (previous_layer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
      uStack_40 = 0;
      local_50 = construct_rhs::tau;
      uVar1 = uVar7 + 1;
      dVar4 = (*f)((double)(int)uVar1 * construct_rhs::h,local_68);
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar7] = -local_48 / local_50 - dVar4;
      uVar7 = uVar1;
    } while (nx - 1 != uVar1);
  }
  p_Var5 = local_58;
  dVar4 = (*local_58)(0.0,local_68);
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar2 = *pdVar2 - (dVar4 / construct_rhs::h) / construct_rhs::h;
  dVar4 = (*p_Var5)(0.7853981633974483,local_68);
  pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3[(long)(int)local_60 + -2] =
       pdVar3[(long)(int)local_60 + -2] - (dVar4 / construct_rhs::h) / construct_rhs::h;
  return __return_storage_ptr__;
}

Assistant:

vec construct_rhs(int nx, int nt, const vec& previous_layer,
        double t, function_2var f, function_2var u)
{
    static int size = compute_linear_system_size(nx - 1);

    vec rhs(size, 0.0);

    static double h = X / nx;
    static double tau = T / nt;

    for (int i = 0; i < nx - 1; i++)
    {
        rhs[i] = -previous_layer[i] / tau - f(h * (i + 1), t);
    }

    rhs[0] -= u(0.0, t) / h / h;
    rhs[nx - 2] -= u(X, t) / h / h;

    return rhs;
}